

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O3

string * __thiscall
cs222::Pass2::parseProgramLength_abi_cxx11_
          (string *__return_storage_ptr__,Pass2 *this,ifstream *ifs)

{
  char cVar1;
  string buffer;
  string line;
  stringstream lineStream;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  stringstream local_1b0 [128];
  ios_base local_130 [264];
  
  local_1c8 = 0;
  local_1c0 = 0;
  local_1d0 = &local_1c0;
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)ifs + -0x18) + (char)ifs);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)ifs,(string *)&local_1d0,cVar1);
  std::__cxx11::stringstream::stringstream(local_1b0,(string *)&local_1d0,_S_out|_S_in);
  local_1e8 = 0;
  local_1e0 = 0;
  local_1f0 = &local_1e0;
  std::operator>>((istream *)local_1b0,(string *)&local_1f0);
  std::operator>>((istream *)local_1b0,(string *)&local_1f0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator>>((istream *)local_1b0,(string *)__return_storage_ptr__);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::parseProgramLength(std::ifstream &ifs) {
        std::string line;
        getline(ifs, line);
        std::stringstream lineStream(line);
        std::string buffer;

        lineStream >> buffer; // Skip "PROGRAM"
        lineStream >> buffer; // Skip "LENGTH:"

        std::string progLength;
        lineStream >> progLength;
        return progLength;
    }